

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

string * __thiscall
MipsOpcodeFormatter::formatOpcode_abi_cxx11_
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  ulong uVar1;
  
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)(this->buffer)._M_string_length,0x18fba2);
  handleOpcodeName(this,opData);
  uVar1 = (this->buffer)._M_string_length;
  while (uVar1 < 0xb) {
    std::__cxx11::string::push_back((char)this);
    uVar1 = (this->buffer)._M_string_length;
  }
  handleOpcodeParameters(this,opData,regData,immData);
  return &this->buffer;
}

Assistant:

const std::string& MipsOpcodeFormatter::formatOpcode(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	buffer = "   ";
	handleOpcodeName(opData);

	while (buffer.size() < 11)
		buffer += ' ';

	handleOpcodeParameters(opData,regData,immData);
	return buffer;
}